

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

boolean is_racial_weapon(obj *otmp,monst *mtmp)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  if (mtmp == &youmonst) {
    if (0xa9 < (ushort)urace.malenum) {
      if (urace.malenum == 0xaa) {
        return '\0';
      }
      if (urace.malenum == 0x111) {
        uVar2 = otmp->otyp;
        if (((ulong)uVar2 < 0x26) && ((0x2040040804U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          return '\x01';
        }
        return uVar2 == 0x43;
      }
      return '\0';
    }
    if (urace.malenum != 0x2d) {
      if (urace.malenum != 0x4a) {
        return '\0';
      }
      uVar2 = otmp->otyp;
      if ((uVar2 < 0x20) && ((0x80081008U >> (uVar2 & 0x1f) & 1) != 0)) {
        return '\x01';
      }
      return uVar2 == 0x44;
    }
    sVar1 = otmp->otyp;
    if (sVar1 == 0xd) {
      return '\x01';
    }
    if (sVar1 == 0x20) {
      return '\x01';
    }
    return sVar1 == 0x33;
  }
  if (mtmp == (monst *)0x0) {
    return '\0';
  }
  uVar3 = mtmp->data->mflags2;
  if ((uVar3 & 0x20) == 0) {
    if ((uVar3 & 0x10) == 0) {
      bVar5 = false;
      bVar4 = false;
      if ((uVar3 & 0x40) != 0) goto LAB_001b2eda;
      if (-1 < (char)uVar3) {
        bVar4 = true;
        goto LAB_001b2eda;
      }
      uVar2 = otmp->otyp;
      if ((uVar2 < 0x20) && ((0x80081008U >> (uVar2 & 0x1f) & 1) != 0)) goto LAB_001b2e94;
      bVar5 = uVar2 == 0x44;
    }
    else {
      uVar2 = otmp->otyp;
      if (((ulong)uVar2 < 0x26) && ((0x2040040804U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
LAB_001b2e94:
        bVar4 = false;
        bVar5 = true;
        goto LAB_001b2eda;
      }
      bVar5 = uVar2 == 0x43;
    }
  }
  else {
    sVar1 = otmp->otyp;
    bVar4 = false;
    bVar5 = true;
    if ((sVar1 == 0xd) || (sVar1 == 0x20)) goto LAB_001b2eda;
    bVar5 = sVar1 == 0x33;
  }
  bVar4 = false;
LAB_001b2eda:
  if (!bVar4) {
    return bVar5;
  }
  return '\0';
}

Assistant:

boolean is_racial_weapon(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_weapon(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_weapon(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_weapon(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_weapon(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_weapon(otmp);
	    else if (is_elf(mdat)) return is_elven_weapon(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_weapon(otmp);
	    else if (is_orc(mdat)) return is_orcish_weapon(otmp);
	}
	return FALSE;
}